

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O3

void Assimp::IFC::ProcessExtrudedArea
               (IfcExtrudedAreaSolid *solid,TempMesh *curve,IfcVector3 *extrusionDir,
               TempMesh *result,ConversionData *conv,bool collect_openings)

{
  double dVar1;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar2;
  pointer pTVar3;
  element_type *peVar4;
  double *pdVar5;
  IfcVector3 *pIVar6;
  _Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter> __comp;
  IfcVector3 __comp_00;
  TempMesh *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  IfcExtrudedAreaSolid *pIVar7;
  bool bVar8;
  int iVar9;
  IfcProfileDef *pIVar10;
  IfcAxis2Placement3D *in_00;
  IfcVector3 *pIVar11;
  ulong uVar12;
  pointer paVar13;
  byte bVar14;
  bool bVar15;
  IfcVector3 *pIVar16;
  aiVector3t<double> *paVar17;
  bool bVar18;
  TempOpening *opening;
  pointer pTVar19;
  ulong uVar20;
  pointer *ppaVar21;
  long lVar22;
  iterator iVar23;
  undefined7 in_register_00000089;
  pointer *ppaVar24;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __last;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __first;
  ulong uVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> in;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> nors;
  aiVector3t<double> res;
  shared_ptr<Assimp::IFC::TempMesh> profile2D;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  TempMesh temp;
  IfcMatrix4 trafo;
  IfcVector3 profileNormal;
  byte local_25c;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_258;
  ConversionData *local_240;
  double local_238;
  undefined4 local_230;
  uint local_22c;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_228;
  IfcVector3 local_208;
  TempOpening local_1e8;
  double local_188;
  double dStack_180;
  TempMesh *local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_170;
  TempMesh *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  TempMesh *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  TempMesh local_148;
  IfcMatrix4 local_118;
  IfcExtrudedAreaSolid *local_90;
  double local_88;
  double dStack_80;
  double local_78;
  IfcExtrudedAreaSolid *local_68;
  double dStack_60;
  double local_58;
  IfcVector3 local_48;
  
  local_240 = conv;
  pIVar10 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                      (*(LazyObject **)
                        &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  iVar9 = std::__cxx11::string::compare
                    (&(pIVar10->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                      field_0x10);
  local_230 = (undefined4)CONCAT71(in_register_00000089,collect_openings);
  if (iVar9 == 0) {
    lVar22 = (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar12 = lVar22 / 0x18;
    if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
      if (uVar12 < 3) {
        return;
      }
      TempMesh::Append(result,curve);
      return;
    }
    local_22c = (uint)(2 < uVar12);
    bVar14 = 2 - (uVar12 < 3);
  }
  else {
    if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
      return;
    }
    lVar22 = (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    bVar14 = 1;
    local_22c = 0;
  }
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,(lVar22 >> 3) * -0x5555555555555555 << (bVar14 & 0x3f));
  local_170 = &result->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&result->mVertcnt,
             ((long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 2);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
            (&local_258,&curve->mVerts);
  local_118.a1 = 1.0;
  local_118.a2 = 0.0;
  local_118.a3 = 0.0;
  local_118.a4 = 0.0;
  local_118.b1 = 0.0;
  local_118.b2 = 1.0;
  local_118.b3 = 0.0;
  local_118.b4 = 0.0;
  local_118.c1 = 0.0;
  local_118.c2 = 0.0;
  local_118.c3 = 1.0;
  local_118.c4 = 0.0;
  local_118.d1 = 0.0;
  local_118.d2 = 0.0;
  local_118.d3 = 0.0;
  local_118.d4 = 1.0;
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                    ((solid->super_IfcSweptAreaSolid).Position.obj);
  ConvertAxisPlacement(&local_118,in_00);
  if (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    local_188 = -20000000000.0;
    dStack_180 = -20000000000.0;
    local_238 = -20000000000.0;
    paVar13 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    paVar13 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar32 = _DAT_006eaf80;
    auVar36 = _DAT_006eaf70;
    dVar27 = -10000000000.0;
    dVar1 = 10000000000.0;
    do {
      dVar29 = ((IfcVector3 *)&paVar13->x)->x;
      dVar28 = paVar13->y;
      dVar30 = paVar13->z;
      local_238 = local_118.c3 * dVar30 + local_118.c1 * dVar29 + local_118.c2 * dVar28 +
                  local_118.c4;
      paVar13->z = local_238;
      dVar33 = local_238;
      if (dVar1 <= local_238) {
        dVar33 = dVar1;
      }
      auVar35._0_8_ =
           dVar30 * local_118.a3 + dVar29 * local_118.a1 + dVar28 * local_118.a2 + local_118.a4;
      auVar35._8_8_ =
           dVar30 * local_118.b3 + dVar29 * local_118.b1 + dVar28 * local_118.b2 + local_118.b4;
      paVar13->x = auVar35._0_8_;
      paVar13->y = auVar35._8_8_;
      auVar31._8_8_ = auVar35._8_8_;
      auVar31._0_8_ = auVar35._0_8_;
      auVar32 = minpd(auVar31,auVar32);
      auVar36 = maxpd(auVar35,auVar36);
      if (local_238 <= dVar27) {
        local_238 = dVar27;
      }
      paVar13 = paVar13 + 1;
      dVar27 = local_238;
      dVar1 = dVar33;
    } while (paVar13 !=
             local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    local_188 = auVar36._0_8_ - auVar32._0_8_;
    dStack_180 = auVar36._8_8_ - auVar32._8_8_;
    local_238 = local_238 - dVar33;
    paVar13 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  dVar1 = extrusionDir->x;
  dVar27 = extrusionDir->y;
  dVar29 = extrusionDir->z;
  local_208.x = dVar29 * local_118.a3 + dVar1 * local_118.a1 + dVar27 * local_118.a2;
  local_208.y = dVar29 * local_118.b3 + dVar1 * local_118.b1 + dVar27 * local_118.b2;
  local_208.z = dVar29 * local_118.c3 + dVar1 * local_118.c1 + dVar27 * local_118.c2;
  TempMesh::ComputePolygonNormal
            (&local_48,
             local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             ((long)paVar13 -
              (long)local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,true);
  local_90 = solid;
  if ((local_48.z * local_208.z + local_48.x * local_208.x + local_48.y * local_208.y < 0.0) &&
     (pIVar16 = local_258.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish + -1,
     pIVar6 = local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
     local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
     super__Vector_impl_data._M_start < pIVar16 &&
     local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
     super__Vector_impl_data._M_start !=
     local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      pIVar11 = pIVar6 + 1;
      local_1e8.extrusionDir.y = pIVar6->z;
      local_1e8.solid = (IfcSolidModel *)((IfcVector3 *)&pIVar6->x)->x;
      local_1e8.extrusionDir.x = pIVar6->y;
      pIVar6->z = pIVar16->z;
      dVar1 = pIVar16->y;
      ((IfcVector3 *)&pIVar6->x)->x = ((IfcVector3 *)&pIVar16->x)->x;
      pIVar6->y = dVar1;
      pIVar16->z = local_1e8.extrusionDir.y;
      ((IfcVector3 *)&pIVar16->x)->x = (double)local_1e8.solid;
      pIVar16->y = local_1e8.extrusionDir.x;
      pIVar16 = pIVar16 + -1;
      pIVar6 = pIVar11;
    } while (pIVar11 < pIVar16);
  }
  ppaVar24 = &(result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish;
  ppaVar21 = &(result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<double> *)0x0;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<double> *)0x0;
  pvVar2 = local_240->apply_openings;
  local_178 = result;
  if (pvVar2 != (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0)
  {
    __first._M_current =
         (pvVar2->
         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>).
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (pvVar2->
         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if ((long)__last._M_current - (long)__first._M_current != 0) {
      if (local_240->settings->useCustomTriangulation == false) {
        local_1e8.solid =
             (IfcSolidModel *)
             ((IfcVector3 *)
             &(local_258.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start)->x)->x;
        local_1e8.extrusionDir.x =
             (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->y;
        local_1e8.extrusionDir.y =
             (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->z;
        __comp_00.x = (local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
        __comp_00.y = (local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y;
        __comp_00.z = (local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z;
        uVar12 = ((long)__last._M_current - (long)__first._M_current >> 3) * 0x2e8ba2e8ba2e8ba3;
        lVar22 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar22 == 0; lVar22 = lVar22 + -1) {
          }
        }
        local_68 = (IfcExtrudedAreaSolid *)local_1e8.solid;
        dStack_60 = local_1e8.extrusionDir.x;
        local_58 = local_1e8.extrusionDir.y;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                  (__first,__last,(ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>)__comp_00);
        __comp._M_comp.base.y = local_1e8.extrusionDir.x;
        __comp._M_comp.base.x = (double)local_1e8.solid;
        __comp._M_comp.base.z = local_1e8.extrusionDir.y;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                  (__first,__last,__comp);
        __first._M_current =
             (local_240->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (local_240->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&local_228,
                 ((long)__last._M_current - (long)__first._M_current >> 3) * 0x2e8ba2e8ba2e8ba3);
      local_170 = &local_148.mVertcnt;
      ppaVar24 = &local_148.mVerts.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      ppaVar21 = &local_148.mVerts.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      pTVar19 = (local_240->apply_openings->
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (local_240->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      result = &local_148;
      local_25c = 1;
      if (pTVar19 != pTVar3) {
        do {
          peVar4 = (pTVar19->profileMesh).
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pdVar5 = &((peVar4->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x;
          if ((ulong)(((long)(peVar4->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) *
                     -0x5555555555555555) < 3) {
            local_1e8.solid = (IfcSolidModel *)0x0;
            local_1e8.extrusionDir.x = 0.0;
            local_1e8.extrusionDir.y = 0.0;
            if (local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_228
                         ,(iterator)
                          local_228.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (aiVector3t<double> *)&local_1e8);
            }
            else {
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = 0.0;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = 0.0;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = 0.0;
LAB_005b425f:
              local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_228.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            dVar1 = pdVar5[6] - *pdVar5;
            dVar30 = pdVar5[7] - pdVar5[1];
            dVar29 = pdVar5[8] - pdVar5[2];
            dVar28 = pdVar5[4] - pdVar5[1];
            dVar33 = pdVar5[5] - pdVar5[2];
            dVar34 = pdVar5[3] - *pdVar5;
            dVar27 = dVar30 * dVar33 - dVar28 * dVar29;
            dVar29 = dVar29 * dVar34 - dVar33 * dVar1;
            local_1e8.extrusionDir.y = dVar1 * dVar28 - dVar34 * dVar30;
            local_1e8.extrusionDir.x =
                 1.0 / SQRT(local_1e8.extrusionDir.y * local_1e8.extrusionDir.y +
                            dVar27 * dVar27 + dVar29 * dVar29);
            local_1e8.extrusionDir.y = local_1e8.extrusionDir.y * local_1e8.extrusionDir.x;
            local_1e8.solid = (IfcSolidModel *)(local_1e8.extrusionDir.x * dVar27);
            local_1e8.extrusionDir.x = local_1e8.extrusionDir.x * dVar29;
            if (local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = local_1e8.extrusionDir.y;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = (double)local_1e8.solid;
              (local_228.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = local_1e8.extrusionDir.x;
              goto LAB_005b425f;
            }
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_228,
                       (iterator)
                       local_228.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(aiVector3t<double> *)&local_1e8);
          }
          pTVar19 = pTVar19 + 1;
        } while (pTVar19 != pTVar3);
      }
      goto LAB_005b429a;
    }
  }
  local_25c = 0;
LAB_005b429a:
  local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((long)local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_238 = (double)((ulong)local_238 & 0xffffffff00000000);
  }
  else {
    local_188 = SQRT(local_238 * local_238 + local_188 * local_188 + dStack_180 * dStack_180) * 0.1;
    uVar12 = ((long)local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar22 = 0;
    local_238 = 0.0;
    uVar25 = 0;
    do {
      uVar25 = uVar25 + 1;
      uVar20 = uVar25;
      if (uVar25 == uVar12) {
        uVar20 = 0;
      }
      local_1e8.solid = (IfcSolidModel *)CONCAT44(local_1e8.solid._4_4_,4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (local_170,(uint *)&local_1e8);
      paVar17 = (aiVector3t<double> *)
                ((long)&((IfcVector3 *)
                        &(local_258.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar22);
      iVar23._M_current = *ppaVar24;
      if (iVar23._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>const&>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar23,
                   paVar17);
        iVar23._M_current = *ppaVar24;
      }
      else {
        (iVar23._M_current)->z = paVar17->z;
        dVar1 = paVar17->y;
        (iVar23._M_current)->x = paVar17->x;
        (iVar23._M_current)->y = dVar1;
        iVar23._M_current = *ppaVar24 + 1;
        *ppaVar24 = iVar23._M_current;
      }
      paVar17 = local_258.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start + uVar20;
      if (iVar23._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>const&>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar23,
                   paVar17);
        iVar23._M_current = *ppaVar24;
      }
      else {
        (iVar23._M_current)->z = paVar17->z;
        dVar1 = paVar17->y;
        (iVar23._M_current)->x = paVar17->x;
        (iVar23._M_current)->y = dVar1;
        iVar23._M_current = *ppaVar24 + 1;
        *ppaVar24 = iVar23._M_current;
      }
      local_1e8.extrusionDir.y =
           local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar20].z + local_208.z;
      local_1e8.solid =
           (IfcSolidModel *)
           (((IfcVector3 *)
            &local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar20].x)->x + local_208.x);
      local_1e8.extrusionDir.x =
           local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar20].y + local_208.y;
      if (iVar23._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar23,
                   (aiVector3t<double> *)&local_1e8);
        iVar23._M_current = *ppaVar24;
      }
      else {
        (iVar23._M_current)->z = local_1e8.extrusionDir.y;
        (iVar23._M_current)->x = (double)local_1e8.solid;
        (iVar23._M_current)->y = local_1e8.extrusionDir.x;
        iVar23._M_current = *ppaVar24 + 1;
        *ppaVar24 = iVar23._M_current;
      }
      local_1e8.extrusionDir.y =
           *(double *)
            ((long)&(local_258.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->z + lVar22) + local_208.z;
      pdVar5 = (double *)
               ((long)&((IfcVector3 *)
                       &(local_258.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar22);
      local_1e8.solid = (IfcSolidModel *)(*pdVar5 + local_208.x);
      local_1e8.extrusionDir.x = pdVar5[1] + local_208.y;
      if (iVar23._M_current == *ppaVar21) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar23,
                   (aiVector3t<double> *)&local_1e8);
      }
      else {
        (iVar23._M_current)->z = local_1e8.extrusionDir.y;
        (iVar23._M_current)->x = (double)local_1e8.solid;
        (iVar23._M_current)->y = local_1e8.extrusionDir.x;
        *ppaVar24 = *ppaVar24 + 1;
      }
      if (local_25c != 0) {
        dVar1 = *(double *)
                 ((long)&((IfcVector3 *)
                         &(local_258.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar22) -
                ((IfcVector3 *)
                &local_258.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar20].x)->x;
        dVar27 = *(double *)
                  ((long)&(local_258.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->y + lVar22) -
                 local_258.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar20].y;
        dVar29 = *(double *)
                  ((long)&(local_258.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->z + lVar22) -
                 local_258.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar20].z;
        if (local_188 < SQRT(dVar29 * dVar29 + dVar1 * dVar1 + dVar27 * dVar27)) {
          bVar8 = GenerateOpenings(local_240->apply_openings,&local_228,&local_148,true,true,
                                   &local_208);
          local_238 = (double)((long)local_238 + (ulong)bVar8);
        }
        TempMesh::Append(local_178,&local_148);
        TempMesh::Clear(&local_148);
      }
      uVar12 = ((long)local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar22 = lVar22 + 0x18;
    } while (uVar25 < uVar12);
    local_238 = (double)CONCAT44(local_238._4_4_,
                                 (int)CONCAT71((int7)(uVar12 >> 8),
                                               local_238 == 4.94065645841247e-324));
  }
  if (local_25c != 0) {
    pTVar3 = (local_240->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pTVar19 = (local_240->apply_openings->
                   super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                   )._M_impl.super__Vector_impl_data._M_start; pTVar19 != pTVar3;
        pTVar19 = pTVar19 + 1) {
      if ((pTVar19->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pTVar19->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5b45dc);
        paVar13 = (pTVar19->wallPoints).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pTVar19->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar13) {
          (pTVar19->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar13;
        }
      }
    }
  }
  if ((char)local_22c == '\0') {
    bVar8 = false;
  }
  else {
    bVar15 = false;
    local_188 = 0.0;
    bVar8 = true;
    do {
      bVar18 = bVar8;
      paVar13 = local_258.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if (bVar15) {
        if (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar22 = 0x10;
          uVar12 = 0;
          do {
            local_1e8.extrusionDir.y =
                 *(double *)
                  ((long)&((IfcVector3 *)
                          &(local_258.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar22) +
                 local_208.z;
            pdVar5 = (double *)
                     ((long)local_258.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar22 + -0x10);
            local_1e8.solid = (IfcSolidModel *)(*pdVar5 + local_208.x);
            local_1e8.extrusionDir.x = pdVar5[1] + local_208.y;
            iVar23._M_current = *ppaVar24;
            if (iVar23._M_current == *ppaVar21) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar23,(aiVector3t<double> *)&local_1e8);
            }
            else {
              (iVar23._M_current)->z = local_1e8.extrusionDir.y;
              (iVar23._M_current)->x = (double)local_1e8.solid;
              (iVar23._M_current)->y = local_1e8.extrusionDir.x;
              *ppaVar24 = *ppaVar24 + 1;
            }
            uVar12 = uVar12 + 1;
            lVar22 = lVar22 + 0x18;
            paVar13 = local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar12 < (ulong)(((long)local_258.
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_258.
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
      }
      else {
        lVar22 = (long)local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_258.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar22 != 0) {
          lVar26 = (lVar22 >> 3) * -0x5555555555555555;
          do {
            paVar17 = (aiVector3t<double> *)
                      ((long)&((IfcVector3 *)
                              &local_258.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].x)->x + lVar22);
            iVar23._M_current = *ppaVar24;
            if (iVar23._M_current == *ppaVar21) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar23,paVar17);
            }
            else {
              (iVar23._M_current)->z = paVar17->z;
              dVar1 = paVar17->y;
              (iVar23._M_current)->x = paVar17->x;
              (iVar23._M_current)->y = dVar1;
              *ppaVar24 = *ppaVar24 + 1;
            }
            lVar26 = lVar26 + -1;
            paVar13 = local_258.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar22 = lVar22 + -0x18;
          } while (lVar26 != 0);
        }
      }
      local_1e8.solid =
           (IfcSolidModel *)
           CONCAT44(local_1e8.solid._4_4_,
                    (int)((ulong)((long)local_258.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13)
                         >> 3) * -0x55555555);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (local_170,(uint *)&local_1e8);
      if ((local_25c != 0) &&
         (2 < (ulong)(((long)local_258.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_258.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
         ) {
        bVar8 = GenerateOpenings(local_240->apply_openings,&local_228,&local_148,true,true,
                                 &local_208);
        TempMesh::Append(local_178,&local_148);
        TempMesh::Clear(&local_148);
        local_188 = (double)((long)local_188 + (ulong)bVar8);
      }
      bVar15 = true;
      bVar8 = false;
    } while (bVar18);
    bVar8 = local_188 == 9.88131291682493e-324;
  }
  pIVar7 = local_90;
  other = local_178;
  if ((local_25c & (SUB81(local_238,0) | bVar8)) == 1) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b4836);
  }
  LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5b4842);
  if (((char)local_230 != '\0') &&
     (((other->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (other->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish ||
      ((other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    if (local_240->collect_openings ==
        (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0) {
      __assert_fail("conv.collect_openings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCGeometry.cpp"
                    ,0x29c,
                    "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                   );
    }
    local_158 = (TempMesh *)operator_new(0x30);
    (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_158->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_158->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_158->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
              (&local_150,local_158);
    TempMesh::Swap(local_158,other);
    local_168 = (TempMesh *)operator_new(0x30);
    (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_168->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_168->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_168->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
              (&local_160,local_168);
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_168,
               (local_168->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_258.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_258.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish);
    local_1e8.solid =
         (IfcSolidModel *)
         CONCAT44(local_1e8.solid._4_4_,
                  (int)((ulong)((long)local_258.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_258.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&local_168->mVertcnt,(uint *)&local_1e8);
    this_00._M_pi = local_150._M_pi;
    this._M_pi = local_160._M_pi;
    pvVar2 = local_240->collect_openings;
    local_88 = local_208.x;
    dStack_80 = local_208.y;
    local_78 = local_208.z;
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
      }
    }
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.extrusionDir.z = local_208.z;
    local_1e8.extrusionDir.x = local_208.x;
    local_1e8.extrusionDir.y = local_208.y;
    local_1e8.solid = (IfcSolidModel *)pIVar7;
    local_1e8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_158;
    local_1e8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_150._M_pi;
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_168;
    local_1e8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_160._M_pi;
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      }
    }
    local_1e8.wallPoints.
    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.wallPoints.
    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.wallPoints.
    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
    emplace_back<Assimp::IFC::TempOpening>(pvVar2,&local_1e8);
    if (local_1e8.wallPoints.
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.wallPoints.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.wallPoints.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.wallPoints.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1e8.profileMesh2D.
        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.profileMesh2D.
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1e8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.profileMesh.
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (((other->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (other->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       ((other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (other->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      __assert_fail("result.IsEmpty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCGeometry.cpp"
                    ,0x2a5,
                    "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                   );
    }
    if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
    }
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
    }
  }
  if (local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.mVertcnt.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.mVertcnt.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.mVertcnt.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.mVerts.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (IfcVector3 *)0x0) {
    operator_delete(local_258.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid& solid, const TempMesh& curve,
    const IfcVector3& extrusionDir, TempMesh& result, ConversionData &conv, bool collect_openings)
{
    // Outline: 'curve' is now a list of vertex points forming the underlying profile, extrude along the given axis,
    // forming new triangles.
    const bool has_area = solid.SweptArea->ProfileType == "AREA" && curve.mVerts.size() > 2;
    if( solid.Depth < 1e-6 ) {
        if( has_area ) {
            result.Append(curve);
        }
        return;
    }

    result.mVerts.reserve(curve.mVerts.size()*(has_area ? 4 : 2));
    result.mVertcnt.reserve(curve.mVerts.size() + 2);
    std::vector<IfcVector3> in = curve.mVerts;

    // First step: transform all vertices into the target coordinate space
    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);
    for(IfcVector3& v : in) {
        v *= trafo;

        vmin = std::min(vmin, v);
        vmax = std::max(vmax, v);
    }

    vmax -= vmin;
    const IfcFloat diag = vmax.Length();
    IfcVector3 dir = IfcMatrix3(trafo) * extrusionDir;

    // reverse profile polygon if it's winded in the wrong direction in relation to the extrusion direction
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(in.data(), in.size());
    if( profileNormal * dir < 0.0 )
        std::reverse(in.begin(), in.end());

    std::vector<IfcVector3> nors;
    const bool openings = !!conv.apply_openings && conv.apply_openings->size();

    // Compute the normal vectors for all opening polygons as a prerequisite
    // to TryAddOpenings_Poly2Tri()
    // XXX this belongs into the aforementioned function
    if( openings ) {

        if( !conv.settings.useCustomTriangulation ) {
            // it is essential to apply the openings in the correct spatial order. The direction
            // doesn't matter, but we would screw up if we started with e.g. a door in between
            // two windows.
            std::sort(conv.apply_openings->begin(), conv.apply_openings->end(), TempOpening::DistanceSorter(in[0]));
        }

        nors.reserve(conv.apply_openings->size());
        for(TempOpening& t : *conv.apply_openings) {
            TempMesh& bounds = *t.profileMesh.get();

            if( bounds.mVerts.size() <= 2 ) {
                nors.push_back(IfcVector3());
                continue;
            }
            nors.push_back(((bounds.mVerts[2] - bounds.mVerts[0]) ^ (bounds.mVerts[1] - bounds.mVerts[0])).Normalize());
        }
    }


    TempMesh temp;
    TempMesh& curmesh = openings ? temp : result;
    std::vector<IfcVector3>& out = curmesh.mVerts;

    size_t sides_with_openings = 0;
    for( size_t i = 0; i < in.size(); ++i ) {
        const size_t next = (i + 1) % in.size();

        curmesh.mVertcnt.push_back(4);

        out.push_back(in[i]);
        out.push_back(in[next]);
        out.push_back(in[next] + dir);
        out.push_back(in[i] + dir);

        if( openings ) {
            if( (in[i] - in[next]).Length() > diag * 0.1 && GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                ++sides_with_openings;
            }

            result.Append(temp);
            temp.Clear();
        }
    }

    if( openings ) {
        for(TempOpening& opening : *conv.apply_openings) {
            if( !opening.wallPoints.empty() ) {
                IFCImporter::LogError("failed to generate all window caps");
            }
            opening.wallPoints.clear();
        }
    }

    size_t sides_with_v_openings = 0;
    if( has_area ) {

        for( size_t n = 0; n < 2; ++n ) {
            if( n > 0 ) {
                for( size_t i = 0; i < in.size(); ++i )
                    out.push_back(in[i] + dir);
            }
            else {
                for( size_t i = in.size(); i--; )
                    out.push_back(in[i]);
            }

            curmesh.mVertcnt.push_back(static_cast<unsigned int>(in.size()));
            if( openings && in.size() > 2 ) {
                if( GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                    ++sides_with_v_openings;
                }

                result.Append(temp);
                temp.Clear();
            }
        }
    }

    if( openings && ((sides_with_openings == 1 && sides_with_openings) || (sides_with_v_openings == 2 && sides_with_v_openings)) ) {
        IFCImporter::LogWarn("failed to resolve all openings, presumably their topology is not supported by Assimp");
    }

    IFCImporter::LogDebug("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");

    // If this is an opening element, store both the extruded mesh and the 2D profile mesh
    // it was created from. Return an empty mesh to the caller.
    if( collect_openings && !result.IsEmpty() ) {
        ai_assert(conv.collect_openings);
        std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
        profile->Swap(result);

        std::shared_ptr<TempMesh> profile2D = std::shared_ptr<TempMesh>(new TempMesh());
        profile2D->mVerts.insert(profile2D->mVerts.end(), in.begin(), in.end());
        profile2D->mVertcnt.push_back(static_cast<unsigned int>(in.size()));
        conv.collect_openings->push_back(TempOpening(&solid, dir, profile, profile2D));

        ai_assert(result.IsEmpty());
    }
}